

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.h
# Opt level: O0

NBestEncodeResult * __thiscall
sentencepiece::ModelInterface::SampleEncodeAndScore
          (ModelInterface *this,string_view normalized,float alpha,int samples,bool wor,
          bool include_best)

{
  initializer_list<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  __l;
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  NBestEncodeResult *in_RDI;
  byte in_R9B;
  byte in_stack_00000008;
  char *in_stack_fffffffffffffe98;
  Die *in_stack_fffffffffffffea0;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_fffffffffffffea8;
  pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
  *in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffec8;
  undefined1 ***pppuVar4;
  vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  *in_stack_fffffffffffffed0;
  undefined1 ***pppuVar5;
  iterator in_stack_fffffffffffffed8;
  undefined1 *puVar6;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined1 **local_78;
  undefined8 *local_70 [4];
  undefined1 **local_50;
  undefined8 local_48;
  byte local_2c;
  Die local_2b;
  byte local_2a;
  byte local_29;
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  iVar1 = logging::GetMinLogLevel();
  local_2c = 0;
  if (iVar1 < 3) {
    error::Die::Die(&local_2b,false);
    local_2c = 1;
    pcVar2 = logging::BaseName(in_stack_fffffffffffffe98);
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6c);
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,"LOG(");
    poVar3 = std::operator<<(poVar3,"ERROR");
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,"Not implemented.");
    error::Die::operator&(&local_2b,poVar3);
  }
  if ((local_2c & 1) != 0) {
    error::Die::~Die(in_stack_fffffffffffffea0);
  }
  local_a1 = 1;
  local_78 = (undefined1 **)local_70;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            *)0x46f2ef);
  local_a0 = 0;
  std::
  pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
  ::
  pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_double,_true>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(double *)in_stack_fffffffffffffea0
            );
  local_a1 = 0;
  local_50 = (undefined1 **)local_70;
  local_48 = 1;
  puVar6 = &local_a2;
  std::
  allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  ::allocator((allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
               *)0x46f34a);
  __l._M_len = (size_type)puVar6;
  __l._M_array = in_stack_fffffffffffffed8;
  std::
  vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  ::vector(in_stack_fffffffffffffed0,__l,in_stack_fffffffffffffec8);
  std::
  allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  ::~allocator((allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
                *)0x46f37b);
  pppuVar5 = (undefined1 ***)local_70;
  pppuVar4 = &local_50;
  do {
    pppuVar4 = pppuVar4 + -4;
    std::
    pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
    ::~pair((pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
             *)0x46f3a4);
  } while (pppuVar4 != pppuVar5);
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~vector(&in_stack_fffffffffffffeb0->first);
  return in_RDI;
}

Assistant:

virtual NBestEncodeResult SampleEncodeAndScore(absl::string_view normalized,
                                                 float alpha, int samples,
                                                 bool wor,
                                                 bool include_best) const {
    LOG(ERROR) << "Not implemented.";
    return {{EncodeResult(), 0.0}};
  }